

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3Detection::forward
          (Yolov3Detection *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  void *pvVar6;
  Mat *pMVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  pointer pMVar12;
  float *pfVar13;
  pointer piVar14;
  long lVar15;
  int x_offset;
  ulong uVar16;
  int iVar17;
  long lVar18;
  pointer pOVar19;
  ulong uVar20;
  int *piVar21;
  long lVar22;
  int iVar23;
  size_t b;
  ulong uVar24;
  long lVar25;
  int q;
  long lVar26;
  float *pfVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  int channels;
  pointer local_220;
  Mat scores;
  float *local_168;
  float *local_160;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  int local_12c;
  int local_128;
  size_t local_120;
  ObjectBox object;
  vector<int,_std::allocator<int>_> mat_steps_channels;
  Mat boxes_score;
  ObjectsManager objects;
  
  channels = ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start)->c;
  mat_steps_channels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mat_steps_channels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mat_steps_channels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::push_back(&mat_steps_channels,&channels);
  pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar17 = pMVar12->h * pMVar12->w;
  lVar25 = 0;
  for (uVar24 = 1;
      uVar24 < (ulong)((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar12 >> 6);
      uVar24 = uVar24 + 1) {
    channels = channels + *(int *)((long)&pMVar12[1].c + lVar25);
    std::vector<int,_std::allocator<int>_>::push_back(&mat_steps_channels,&channels);
    pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar17 = (int)((float)(*(int *)((long)&pMVar12[1].h + lVar25) *
                           *(int *)((long)&pMVar12[1].w + lVar25) + iVar17) * 0.5);
    lVar25 = lVar25 + 0x40;
  }
  iVar11 = channels / this->box_num;
  if (iVar11 == this->classes + 5) {
    ObjectsManager::ObjectsManager(&objects,(long)((this->box_num * iVar17) / 0x14));
    for (lVar25 = 0; lVar25 < this->box_num; lVar25 = lVar25 + 1) {
      lVar18 = lVar25 * iVar11;
      piVar14 = mat_steps_channels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar22 = 0;
      lVar10 = -0x40;
      do {
        lVar26 = lVar10;
        lVar15 = lVar22;
        iVar17 = *piVar14;
        piVar14 = piVar14 + 1;
        lVar22 = (long)iVar17;
        lVar10 = lVar26 + 0x40;
      } while (iVar17 <= lVar18);
      pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar7 = (Mat *)((long)&pMVar12[1].data + lVar26);
      iVar17 = (int)lVar18 - (int)lVar15;
      Mat::channel_range((Mat *)&detected_objects,pMVar7,iVar17,2);
      (*this->sigmoid->_vptr_Layer[9])(this->sigmoid,(Mat *)&detected_objects,opt);
      Mat::channel_range(&boxes_score,pMVar7,iVar17 + 4,1);
      local_220 = pMVar12;
      (*this->sigmoid->_vptr_Layer[9])(this->sigmoid,&boxes_score,opt);
      pOVar19 = detected_objects.
                super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                super__Vector_impl_data._M_start;
      scores.data = detected_objects.
                    super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                    super__Vector_impl_data._M_start;
      scores.refcount = (int *)0x0;
      scores.elemsize =
           (size_t)detected_objects.
                   super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      scores.cstep = (size_t)(local_128 * local_12c);
      scores.dims = 2;
      scores.c = 1;
      Mat::~Mat(&scores);
      pfVar27 = (float *)((long)&(detected_objects.
                                  super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->xmin +
                         local_120 *
                         (long)detected_objects.
                               super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      scores.refcount = (int *)0x0;
      scores.elemsize =
           (size_t)detected_objects.
                   super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      scores.cstep = (size_t)(local_128 * local_12c);
      scores.data = pfVar27;
      scores.dims = 2;
      scores.c = 1;
      Mat::~Mat(&scores);
      Mat::channel(&scores,pMVar7,iVar17 + 2);
      pfVar13 = (float *)scores.data;
      Mat::~Mat(&scores);
      Mat::channel(&scores,pMVar7,iVar17 + 3);
      local_160 = (float *)scores.data;
      Mat::~Mat(&scores);
      local_168 = (float *)boxes_score.data;
      scores.data = boxes_score.data;
      scores.refcount = (int *)0x0;
      scores.elemsize = boxes_score.elemsize;
      scores.elempack = boxes_score.elempack;
      scores.allocator = boxes_score.allocator;
      scores.dims = 2;
      scores.w = boxes_score.w;
      scores.h = boxes_score.h;
      scores.c = 1;
      scores.cstep = (size_t)(boxes_score.h * boxes_score.w);
      Mat::~Mat(&scores);
      Mat::channel_range(&scores,pMVar7,iVar17 + 5,this->classes);
      (*(&this->softmax)[this->softmax_enable == 0]->_vptr_Layer[9])
                ((&this->softmax)[this->softmax_enable == 0],&scores,opt);
      uVar5 = *(uint *)((long)&local_220[1].w + lVar26);
      iVar17 = *(int *)((long)&local_220[1].h + lVar26);
      iVar8 = this->net_height;
      uVar9 = this->net_width;
      if (this->net_width == 0 || this->net_height == 0) {
        iVar8 = iVar17;
        uVar9 = uVar5;
      }
      pvVar6 = (this->biases).data;
      fVar1 = *(float *)((long)pvVar6 + lVar25 * 8);
      fVar31 = (float)iVar17;
      uVar16 = 0;
      uVar24 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar24 = uVar16;
      }
      fVar2 = *(float *)((long)pvVar6 + lVar25 * 8 + 4);
      if (iVar17 < 1) {
        iVar17 = 0;
      }
      while (iVar23 = (int)uVar16, iVar23 != iVar17) {
        for (uVar16 = 0; uVar16 != uVar24; uVar16 = uVar16 + 1) {
          fVar29 = expf(*pfVar13);
          local_220._0_4_ = fVar29 * fVar1 * (1.0 / (float)(int)uVar9);
          fVar29 = expf(*local_160);
          fVar30 = fVar29 * fVar2 * (1.0 / (float)iVar8);
          fVar32 = ((float)(int)uVar16 + pOVar19->xmin) * (1.0 / (float)(int)uVar5) -
                   local_220._0_4_ * 0.5;
          fVar29 = *pfVar27;
          local_220 = (pointer)CONCAT44(local_220._4_4_,local_220._0_4_ + fVar32);
          fVar3 = *local_168;
          fVar33 = 0.0;
          uVar20 = 0;
          for (uVar28 = 0; (long)uVar28 < (long)this->classes; uVar28 = uVar28 + 1) {
            object._0_8_ = scores.cstep * uVar28 * scores.elemsize + (long)scores.data;
            object.xmax = 0.0;
            object.ymax = 0.0;
            object.prob = (float)(undefined4)scores.elemsize;
            object.classid = scores.elemsize._4_4_;
            fVar4 = *(float *)(object._0_8_ +
                              uVar16 * 4 + (long)(scores.w * iVar23) * scores.elemsize);
            Mat::~Mat((Mat *)&object);
            if (fVar33 < fVar4) {
              uVar20 = uVar28 & 0xffffffff;
            }
            if (fVar33 <= fVar4) {
              fVar33 = fVar4;
            }
          }
          if (this->confidence_threshold <= fVar33 * fVar3) {
            object.ymin = (fVar29 + (float)iVar23) * (1.0 / fVar31) - fVar30 * 0.5;
            object.xmin = fVar32;
            object.ymax = fVar30 + object.ymin;
            object.xmax = SUB84(local_220,0);
            object.classid = (int)uVar20;
            object.prob = fVar33 * fVar3;
            ObjectsManager::add_new_object_box(&objects,&object);
          }
          pOVar19 = (pointer)&pOVar19->ymin;
          pfVar27 = pfVar27 + 1;
          pfVar13 = pfVar13 + 1;
          local_160 = local_160 + 1;
          local_168 = local_168 + 1;
        }
        uVar16 = (ulong)(iVar23 + 1);
      }
      Mat::~Mat(&scores);
      Mat::~Mat(&boxes_score);
      Mat::~Mat((Mat *)&detected_objects);
    }
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    detected_objects.super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ObjectsManager::do_objects_nms
              (&objects,&detected_objects,this->nms_threshold,this->confidence_threshold);
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,6,(int)(((long)detected_objects.
                                      super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)detected_objects.
                                     super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x18),4,
                opt->blob_allocator);
    pvVar6 = pMVar7->data;
    iVar17 = -100;
    if ((pvVar6 != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
      piVar21 = &(detected_objects.
                  super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                  super__Vector_impl_data._M_start)->classid;
      iVar17 = 0;
      for (lVar25 = 0;
          ((long)detected_objects.
                 super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)detected_objects.
                super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18 != lVar25; lVar25 = lVar25 + 1) {
        lVar22 = (long)(int)lVar25 * (long)pMVar7->w * pMVar7->elemsize;
        *(float *)((long)pvVar6 + lVar22) = (float)(*piVar21 + 1);
        *(int *)((long)pvVar6 + lVar22 + 4) = piVar21[-1];
        *(float *)((long)pvVar6 + lVar22 + 8) = ((ObjectBox *)(piVar21 + -5))->xmin;
        *(int *)((long)pvVar6 + lVar22 + 0xc) = piVar21[-4];
        *(int *)((long)pvVar6 + lVar22 + 0x10) = piVar21[-3];
        *(int *)((long)pvVar6 + lVar22 + 0x14) = piVar21[-2];
        piVar21 = piVar21 + 6;
      }
    }
    std::_Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~_Vector_base
              (&detected_objects.
                super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>);
    ObjectsManager::~ObjectsManager(&objects);
  }
  else {
    iVar17 = -1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mat_steps_channels.super__Vector_base<int,_std::allocator<int>_>);
  return iVar17;
}

Assistant:

int Yolov3Detection::forward(const std::vector<Mat> &bottom_blobs, std::vector<Mat> &top_blobs, const Option &opt) const
{
    int channels = bottom_blobs[0].c;
    std::vector<int> mat_steps_channels;
    mat_steps_channels.push_back(channels);
    int prob_steps = bottom_blobs[0].w * bottom_blobs[0].h;
    for (size_t b = 1; b < bottom_blobs.size(); b++)
    {
        channels += bottom_blobs[b].c;
        mat_steps_channels.push_back(channels);
        prob_steps += bottom_blobs[b].w * bottom_blobs[b].h;
        prob_steps *= 0.5f;
    }

    const int channels_per_box = channels / box_num;

    // anchor coord + box score + num_class
    if (channels_per_box != 4 + 1 + classes)
        return -1;
        
    ObjectsManager objects(prob_steps * box_num / 20);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < box_num; pp++)
    {
        int p = pp * channels_per_box;

        int current_mat_index = 0;
        int front_mat_channels = 0;
        while (p >= mat_steps_channels[current_mat_index])
        {
            front_mat_channels = mat_steps_channels[current_mat_index];
            current_mat_index++;
        }

        const Mat &bottom_blob = bottom_blobs[current_mat_index];
        p -= front_mat_channels;

        Mat locations = bottom_blob.channel_range(p, 2);
        sigmoid->forward_inplace(locations, opt);
        Mat boxes_score = bottom_blob.channel_range(p + 4, 1);
        sigmoid->forward_inplace(boxes_score, opt);

        const float *xptr = locations.channel(0);
        const float *yptr = locations.channel(1);
        const float *wptr = bottom_blob.channel(p + 2);
        const float *hptr = bottom_blob.channel(p + 3);

        const float *box_score_ptr = boxes_score.channel(0);

        Mat scores = bottom_blob.channel_range(p + 5, classes);
        if (softmax_enable)
        {
            // softmax class scores
            softmax->forward_inplace(scores, opt);
        }
        else
        {
            // Not use softmax to avoid class competition
            sigmoid->forward_inplace(scores, opt);
        }

        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int real_w = w, real_h = h;
        if (net_height != 0 && net_width != 0)
        {
            real_w = net_width;
            real_h = net_height;
        }

        const float bias_w = biases[pp * 2] / real_w;
        const float bias_h = biases[pp * 2 + 1] / real_h;

        for (int y_offset = 0; y_offset < h; y_offset++)
        {
            for (int x_offset = 0; x_offset < w; x_offset++)
            {

                float box_w = exp(wptr[0]) * bias_w;
                float box_h = exp(hptr[0]) * bias_h;

                float xmin = (xptr[0] + x_offset) / w - box_w * 0.5f;
                float ymin = (yptr[0] + y_offset) / h - box_h * 0.5f;
                float xmax = xmin + box_w;
                float ymax = ymin + box_h;

                // box score
                float box_score = box_score_ptr[0];

                // find class index with max class score
                int class_index = 0;
                float class_score = 0.f;
                for (int q = 0; q < classes; q ++)
                {
                    float score = scores.channel(q).row(y_offset)[x_offset];

                    if (score > class_score)
                    {
                        class_index = q;
                        class_score = score;
                    }
                }

                float prob = box_score * class_score;
                if (prob >= confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = class_index,
                    };
                    objects.add_new_object_box(object);
                }

                xptr++;
                yptr++;
                wptr++;
                hptr++;

                box_score_ptr++;
            }
        }
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    Mat &top_blob = top_blobs[0];
    top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);

    if (top_blob.empty())
        return -100;

    for (size_t i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}